

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O2

Cord __thiscall absl::lts_20240722::Cord::Subcord(Cord *this,size_t pos,size_t new_size)

{
  char *src;
  size_t sVar1;
  Nullable<absl::cord_internal::CordRep_*> rep;
  pointer pbVar2;
  Nullable<const_char_*> pcVar3;
  CordRep *rep_00;
  CordRepBtree *pCVar4;
  Nonnull<CordRep_*> rep_01;
  ulong in_RCX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar5;
  ulong n;
  char *dst;
  Cord CVar6;
  ChunkIterator it;
  
  (this->contents_).data_.rep_.field_0.as_tree.cordz_info = 0;
  (this->contents_).data_.rep_.field_0.as_tree.rep = (CordRep *)0x0;
  sVar1 = InlineRep::size((InlineRep *)pos);
  if (sVar1 < new_size) {
    new_size = sVar1;
  }
  n = sVar1 - new_size;
  if (in_RCX <= sVar1 - new_size) {
    n = in_RCX;
  }
  uVar5 = extraout_RDX;
  if (n != 0) {
    rep = InlineRep::tree((InlineRep *)pos);
    if (rep == (Nullable<absl::cord_internal::CordRep_*>)0x0) {
      pcVar3 = InlineRep::data((InlineRep *)pos);
      cord_internal::InlineData::set_inline_data((InlineData *)this,pcVar3 + new_size,n);
      uVar5 = extraout_RDX_00;
    }
    else if (n < 0x10) {
      cord_internal::InlineData::Rep::set_inline_size((Rep *)this,n);
      ChunkIterator::ChunkIterator(&it,(Nonnull<const_Cord_*>)pos);
      ChunkIterator::AdvanceBytes(&it,new_size);
      dst = (this->contents_).data_.rep_.field_0.data + 1;
      while( true ) {
        pbVar2 = ChunkIterator::operator->(&it);
        if (n <= pbVar2->_M_len) break;
        pbVar2 = ChunkIterator::operator->(&it);
        src = pbVar2->_M_str;
        pbVar2 = ChunkIterator::operator->(&it);
        cord_internal::SmallMemmove<false>(dst,src,pbVar2->_M_len);
        pbVar2 = ChunkIterator::operator->(&it);
        sVar1 = pbVar2->_M_len;
        pbVar2 = ChunkIterator::operator->(&it);
        n = n - sVar1;
        dst = dst + pbVar2->_M_len;
        ChunkIterator::operator++(&it);
      }
      pbVar2 = ChunkIterator::operator->(&it);
      cord_internal::SmallMemmove<false>(dst,pbVar2->_M_str,n);
      uVar5 = extraout_RDX_01;
    }
    else {
      rep_00 = cord_internal::SkipCrcNode(rep);
      if (rep_00->tag == '\x03') {
        pCVar4 = cord_internal::CordRep::btree(rep_00);
        rep_01 = (Nonnull<CordRep_*>)
                 absl::lts_20240722::cord_internal::CordRepBtree::SubTree((ulong)pCVar4,new_size);
      }
      else {
        rep_01 = cord_internal::CordRepSubstring::Substring(rep_00,new_size,n);
      }
      InlineRep::EmplaceTree(&this->contents_,rep_01,(InlineData *)pos,kSubCord);
      uVar5 = extraout_RDX_02;
    }
  }
  CVar6.contents_.data_.rep_.field_0.as_tree.rep = (CordRep *)uVar5;
  CVar6.contents_.data_.rep_.field_0.as_tree.cordz_info = (cordz_info_t)this;
  return (Cord)CVar6.contents_.data_.rep_.field_0;
}

Assistant:

Cord Cord::Subcord(size_t pos, size_t new_size) const {
  Cord sub_cord;
  size_t length = size();
  if (pos > length) pos = length;
  if (new_size > length - pos) new_size = length - pos;
  if (new_size == 0) return sub_cord;

  CordRep* tree = contents_.tree();
  if (tree == nullptr) {
    sub_cord.contents_.set_data(contents_.data() + pos, new_size);
    return sub_cord;
  }

  if (new_size <= InlineRep::kMaxInline) {
    sub_cord.contents_.set_inline_size(new_size);
    char* dest = sub_cord.contents_.data_.as_chars();
    Cord::ChunkIterator it = chunk_begin();
    it.AdvanceBytes(pos);
    size_t remaining_size = new_size;
    while (remaining_size > it->size()) {
      cord_internal::SmallMemmove(dest, it->data(), it->size());
      remaining_size -= it->size();
      dest += it->size();
      ++it;
    }
    cord_internal::SmallMemmove(dest, it->data(), remaining_size);
    return sub_cord;
  }

  tree = cord_internal::SkipCrcNode(tree);
  if (tree->IsBtree()) {
    tree = tree->btree()->SubTree(pos, new_size);
  } else {
    tree = CordRepSubstring::Substring(tree, pos, new_size);
  }
  sub_cord.contents_.EmplaceTree(tree, contents_.data_,
                                 CordzUpdateTracker::kSubCord);
  return sub_cord;
}